

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddSharedDepItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  cmOrderDirectories *this_00;
  bool bVar1;
  TargetType TVar2;
  long lVar3;
  string lib;
  string soName;
  string local_68;
  string local_48;
  
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }
  if (tgt == (cmGeneratorTarget *)0x0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((item->_M_dataplus)._M_p);
    if (!bVar1) {
      return;
    }
    cmsys::SystemTools::GetFilenameName(&local_68,item);
    bVar1 = cmsys::RegularExpression::find
                      (&this->ExtractSharedLibraryName,local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar1) {
      return;
    }
    if (this->SharedDependencyMode == SharedDepModeLink) goto LAB_003393b3;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_assign((string *)&local_68);
    AddLibraryRuntimeInfo(this,&local_68);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(tgt);
    if (TVar2 != SHARED_LIBRARY) {
      return;
    }
    if (this->SharedDependencyMode == SharedDepModeLink) {
LAB_003393b3:
      AddItem(this,item,tgt);
      return;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    cmGeneratorTarget::GetFullPath(&local_48,tgt,&this->Config,this->UseImportLibrary,false);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    AddLibraryRuntimeInfo(this,&local_68,tgt);
  }
  if (this->SharedDependencyMode == SharedDepModeDir) {
    lVar3 = 0x758;
  }
  else if ((this->SharedDependencyMode != SharedDepModeLibDir) ||
          (lVar3 = 0x648, this->LinkWithRuntimePath != false)) goto LAB_0033947b;
  this_00 = *(cmOrderDirectories **)
             ((long)&(this->Items).
                     super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar3);
  if (this_00 != (cmOrderDirectories *)0x0) {
    if (tgt == (cmGeneratorTarget *)0x0) {
      cmOrderDirectories::AddRuntimeLibrary(this_00,&local_68,(char *)0x0);
    }
    else {
      cmGeneratorTarget::GetSOName(&local_48,tgt,&this->Config);
      if ((char *)local_48._M_string_length != (char *)0x0) {
        local_48._M_string_length = (size_type)local_48._M_dataplus._M_p;
      }
      cmOrderDirectories::AddRuntimeLibrary(this_00,&local_68,(char *)local_48._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0033947b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedDepItem(std::string const& item,
                                                const cmGeneratorTarget* tgt)
{
  // If dropping shared library dependencies, ignore them.
  if(this->SharedDependencyMode == SharedDepModeNone)
    {
    return;
    }

  // The user may have incorrectly named an item.  Skip items that are
  // not full paths to shared libraries.
  if(tgt)
    {
    // The target will provide a full path.  Make sure it is a shared
    // library.
    if(tgt->GetType() != cmState::SHARED_LIBRARY)
      {
      return;
      }
    }
  else
    {
    // Skip items that are not full paths.  We will not be able to
    // reliably specify them.
    if(!cmSystemTools::FileIsFullPath(item.c_str()))
      {
      return;
      }

    // Get the name of the library from the file name.
    std::string file = cmSystemTools::GetFilenameName(item);
    if(!this->ExtractSharedLibraryName.find(file.c_str()))
      {
      // This is not the name of a shared library.
      return;
      }
    }

  // If in linking mode, just link to the shared library.
  if(this->SharedDependencyMode == SharedDepModeLink)
    {
    this->AddItem(item, tgt);
    return;
    }

  // Get a full path to the dependent shared library.
  // Add it to the runtime path computation so that the target being
  // linked will be able to find it.
  std::string lib;
  if(tgt)
    {
    lib = tgt->GetFullPath(this->Config, this->UseImportLibrary);
    this->AddLibraryRuntimeInfo(lib, tgt);
    }
  else
    {
    lib = item;
    this->AddLibraryRuntimeInfo(lib);
    }

  // Check if we need to include the dependent shared library in other
  // path ordering.
  cmOrderDirectories* order = 0;
  if(this->SharedDependencyMode == SharedDepModeLibDir &&
     !this->LinkWithRuntimePath /* AddLibraryRuntimeInfo adds it */)
    {
    // Add the item to the linker search path.
    order = this->OrderLinkerSearchPath;
    }
  else if(this->SharedDependencyMode == SharedDepModeDir)
    {
    // Add the item to the separate dependent library search path.
    order = this->OrderDependentRPath;
    }
  if(order)
    {
    if(tgt)
      {
      std::string soName = tgt->GetSOName(this->Config);
      const char* soname = soName.empty()? 0 : soName.c_str();
      order->AddRuntimeLibrary(lib, soname);
      }
    else
      {
      order->AddRuntimeLibrary(lib);
      }
    }
}